

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseOpenRangeElement
          (Parser *this,bitmask<slang::parsing::detail::ExpressionOptions> options)

{
  bool bVar1;
  ExpressionSyntax *left_00;
  ExpressionSyntax *right_00;
  Token openBracket_00;
  Token colon_00;
  Token closeBracket_00;
  Token closeBracket;
  ExpressionSyntax *right;
  Token colon;
  ExpressionSyntax *left;
  Token openBracket;
  Parser *this_local;
  OpenRangeExpressionSyntax *pOStack_10;
  bitmask<slang::parsing::detail::ExpressionOptions> options_local;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBracket);
  if (bVar1) {
    openBracket_00 = ParserBase::consume(&this->super_ParserBase);
    left_00 = parseExpression(this);
    colon_00 = ParserBase::expect(&this->super_ParserBase,Colon);
    right_00 = parseExpression(this);
    closeBracket_00 = ParserBase::expect(&this->super_ParserBase,CloseBracket);
    pOStack_10 = slang::syntax::SyntaxFactory::openRangeExpression
                           (&this->factory,openBracket_00,left_00,colon_00,right_00,closeBracket_00)
    ;
  }
  else {
    pOStack_10 = (OpenRangeExpressionSyntax *)parseSubExpression(this,options,0);
  }
  return &pOStack_10->super_ExpressionSyntax;
}

Assistant:

ExpressionSyntax& Parser::parseOpenRangeElement(bitmask<ExpressionOptions> options) {
    if (!peek(TokenKind::OpenBracket))
        return parseSubExpression(options, 0);

    auto openBracket = consume();
    auto& left = parseExpression();
    auto colon = expect(TokenKind::Colon);
    auto& right = parseExpression();
    auto closeBracket = expect(TokenKind::CloseBracket);
    return factory.openRangeExpression(openBracket, left, colon, right, closeBracket);
}